

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprPhrase *
sqlite3Fts5ParseTerm(Fts5Parse *pParse,Fts5ExprPhrase *pAppend,Fts5Token *pToken,int bPrefix)

{
  uint uVar1;
  size_t sVar2;
  Fts5ExprPhrase **ppFVar3;
  Fts5ExprPhrase **apNew;
  sqlite3_int64 nByte;
  int n;
  int flags;
  char *z;
  Fts5ExprPhrase *pFStack_48;
  int rc;
  TokenCtx sCtx;
  Fts5Config *pConfig;
  int bPrefix_local;
  Fts5Token *pToken_local;
  Fts5ExprPhrase *pAppend_local;
  Fts5Parse *pParse_local;
  
  sCtx._8_8_ = pParse->pConfig;
  _n = (char *)0x0;
  memset(&stack0xffffffffffffffb8,0,0x10);
  pFStack_48 = pAppend;
  z._4_4_ = fts5ParseStringFromToken(pToken,(char **)&n);
  if (z._4_4_ == 0) {
    uVar1 = 0;
    if (bPrefix != 0) {
      uVar1 = 2;
    }
    sqlite3Fts5Dequote(_n);
    sVar2 = strlen(_n);
    z._4_4_ = sqlite3Fts5Tokenize((Fts5Config *)sCtx._8_8_,uVar1 | 1,_n,(int)sVar2,
                                  &stack0xffffffffffffffb8,fts5ParseTokenize);
  }
  sqlite3_free(_n);
  if ((z._4_4_ == 0) && (z._4_4_ = (int)sCtx.pPhrase, (int)sCtx.pPhrase == 0)) {
    if (pAppend == (Fts5ExprPhrase *)0x0) {
      if (pParse->nPhrase % 8 == 0) {
        ppFVar3 = (Fts5ExprPhrase **)
                  sqlite3_realloc64(pParse->apPhrase,(long)(pParse->nPhrase + 8) << 3);
        if (ppFVar3 == (Fts5ExprPhrase **)0x0) {
          pParse->rc = 7;
          fts5ExprPhraseFree(pFStack_48);
          return (Fts5ExprPhrase *)0x0;
        }
        pParse->apPhrase = ppFVar3;
      }
      pParse->nPhrase = pParse->nPhrase + 1;
    }
    if (pFStack_48 == (Fts5ExprPhrase *)0x0) {
      pFStack_48 = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&pParse->rc,0x40);
    }
    else if (pFStack_48->nTerm != 0) {
      pFStack_48->aTerm[pFStack_48->nTerm + -1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[pParse->nPhrase + -1] = pFStack_48;
  }
  else {
    pParse->rc = z._4_4_;
    fts5ExprPhraseFree(pFStack_48);
    pFStack_48 = (Fts5ExprPhrase *)0x0;
  }
  return pFStack_48;
}

Assistant:

static Fts5ExprPhrase *sqlite3Fts5ParseTerm(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprPhrase *pAppend,        /* Phrase to append to */
  Fts5Token *pToken,              /* String to tokenize */
  int bPrefix                     /* True if there is a trailing "*" */
){
  Fts5Config *pConfig = pParse->pConfig;
  TokenCtx sCtx;                  /* Context object passed to callback */
  int rc;                         /* Tokenize return code */
  char *z = 0;

  memset(&sCtx, 0, sizeof(TokenCtx));
  sCtx.pPhrase = pAppend;

  rc = fts5ParseStringFromToken(pToken, &z);
  if( rc==SQLITE_OK ){
    int flags = FTS5_TOKENIZE_QUERY | (bPrefix ? FTS5_TOKENIZE_PREFIX : 0);
    int n;
    sqlite3Fts5Dequote(z);
    n = (int)strlen(z);
    rc = sqlite3Fts5Tokenize(pConfig, flags, z, n, &sCtx, fts5ParseTokenize);
  }
  sqlite3_free(z);
  if( rc || (rc = sCtx.rc) ){
    pParse->rc = rc;
    fts5ExprPhraseFree(sCtx.pPhrase);
    sCtx.pPhrase = 0;
  }else{

    if( pAppend==0 ){
      if( (pParse->nPhrase % 8)==0 ){
        sqlite3_int64 nByte = sizeof(Fts5ExprPhrase*) * (pParse->nPhrase + 8);
        Fts5ExprPhrase **apNew;
        apNew = (Fts5ExprPhrase**)sqlite3_realloc64(pParse->apPhrase, nByte);
        if( apNew==0 ){
          pParse->rc = SQLITE_NOMEM;
          fts5ExprPhraseFree(sCtx.pPhrase);
          return 0;
        }
        pParse->apPhrase = apNew;
      }
      pParse->nPhrase++;
    }

    if( sCtx.pPhrase==0 ){
      /* This happens when parsing a token or quoted phrase that contains
      ** no token characters at all. (e.g ... MATCH '""'). */
      sCtx.pPhrase = sqlite3Fts5MallocZero(&pParse->rc, sizeof(Fts5ExprPhrase));
    }else if( sCtx.pPhrase->nTerm ){
      sCtx.pPhrase->aTerm[sCtx.pPhrase->nTerm-1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[pParse->nPhrase-1] = sCtx.pPhrase;
  }

  return sCtx.pPhrase;
}